

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

void QSslSocketPrivate::setDefaultCiphers(QList<QSslCipher> *ciphers)

{
  __pointer_type pQVar1;
  QSslConfigurationPrivate *pQVar2;
  Type *pTVar3;
  Type *pTVar4;
  Type *pTVar5;
  bool bVar6;
  
  pTVar5 = (Type *)ciphers;
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)ciphers);
  if (pTVar3 != (Type *)0x0) {
    if ((pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar6 = (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar6) {
        (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar6) goto LAB_0016e43c;
    }
    pTVar5 = pTVar3;
    QBasicMutex::lockInternal();
  }
LAB_0016e43c:
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)pTVar5);
  pQVar2 = (pTVar4->config).d.ptr;
  if ((pQVar2 != (QSslConfigurationPrivate *)0x0) &&
     ((__int_type)
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1)) {
    pTVar5 = (Type *)&pTVar4->config;
    QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach_helper
              ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)pTVar5);
  }
  pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)pTVar5);
  QArrayDataPointer<QSslCipher>::operator=(&(((pTVar5->config).d.ptr)->ciphers).d,&ciphers->d);
  if (pTVar3 != (Type *)0x0) {
    LOCK();
    pQVar1 = (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
    (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar1 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(pTVar3);
      return;
    }
  }
  return;
}

Assistant:

void QSslSocketPrivate::setDefaultCiphers(const QList<QSslCipher> &ciphers)
{
    QMutexLocker locker(&globalData()->mutex);
    globalData()->config.detach();
    globalData()->config->ciphers = ciphers;
}